

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

int ScanEol(ConfigScanner *sc)

{
  char cVar1;
  ConfigScanner *sc_local;
  int local_4;
  
  cVar1 = *sc->ptr;
  if (cVar1 == '\0') {
    local_4 = 1;
  }
  else if (cVar1 == '\n') {
    sc->ptr = sc->ptr + 1;
    local_4 = 1;
  }
  else if (cVar1 == '\r') {
    sc->ptr = sc->ptr + 1;
    if (*sc->ptr == '\n') {
      sc->ptr = sc->ptr + 1;
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ScanEol(ConfigScanner *sc)
{
	switch (*sc->ptr)
	{
	case '\0':
		return true;
	case '\n':
		sc->ptr++;
		return true;
	case '\r':
		sc->ptr++;
		if (*sc->ptr == '\n')
		{
			sc->ptr++;
		}
		return true;
	default:
		return false;
	}
}